

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_MeshFace::IsPlanar
          (ON_MeshFace *this,double planar_tolerance,double angle_tolerance_radians,
          ON_3dPointListRef *vertex_list,ON_PlaneEquation *face_plane_equation)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  float *pfVar5;
  ON_3dPoint P;
  bool bVar6;
  ulong uVar7;
  ON_3dVector *corner_normals_00;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  ON_PlaneEquation e;
  ON_3dVector corner_normals [4];
  double local_e0;
  ON_PlaneEquation local_a8;
  ON_3dVector local_88 [4];
  
  ON_PlaneEquation::ON_PlaneEquation(&local_a8);
  bVar6 = GetPlaneEquation(this,vertex_list,&local_a8);
  dVar2 = ON_PlaneEquation::UnsetPlaneEquation.d;
  dVar1 = ON_PlaneEquation::UnsetPlaneEquation.y;
  dVar11 = ON_PlaneEquation::UnsetPlaneEquation.x;
  if (bVar6) {
    if (face_plane_equation != (ON_PlaneEquation *)0x0) {
      face_plane_equation->z = local_a8.z;
      face_plane_equation->d = local_a8.d;
      face_plane_equation->x = local_a8.x;
      face_plane_equation->y = local_a8.y;
    }
    bVar6 = true;
    if (this->vi[2] != this->vi[3]) {
      dVar11 = 0.0;
      if (0.0 <= planar_tolerance) {
        lVar8 = 0;
        local_e0 = 0.0;
        do {
          uVar3 = this->vi[lVar8 + 1];
          if (this->vi[lVar8] != uVar3) {
            dVar12 = -1.23432101234321e+308;
            dVar1 = -1.23432101234321e+308;
            dVar2 = dVar1;
            if (-1 < (int)uVar3) {
              dVar12 = -1.23432101234321e+308;
              dVar1 = -1.23432101234321e+308;
              dVar2 = -1.23432101234321e+308;
              if (uVar3 < vertex_list->m_point_count) {
                pdVar4 = vertex_list->m_dP;
                if (pdVar4 == (double *)0x0) {
                  pfVar5 = vertex_list->m_fP;
                  uVar7 = (ulong)(uVar3 * vertex_list->m_point_stride);
                  dVar1 = (double)pfVar5[uVar7];
                  dVar2 = (double)pfVar5[uVar7 + 1];
                  dVar12 = (double)pfVar5[uVar7 + 2];
                }
                else {
                  uVar7 = (ulong)(uVar3 * vertex_list->m_point_stride);
                  dVar1 = pdVar4[uVar7];
                  dVar2 = pdVar4[uVar7 + 1];
                  dVar12 = pdVar4[uVar7 + 2];
                }
              }
            }
            P.y = dVar2;
            P.x = dVar1;
            P.z = dVar12;
            dVar1 = ON_PlaneEquation::ValueAt(&local_a8,P);
            if (dVar11 <= dVar1) {
              uVar9 = SUB84(dVar1,0);
              uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
              if (dVar1 <= local_e0) goto LAB_0050a789;
            }
            else {
              uVar9 = SUB84(local_e0,0);
              uVar10 = (undefined4)((ulong)local_e0 >> 0x20);
              dVar11 = dVar1;
            }
            local_e0 = (double)CONCAT44(uVar10,uVar9);
            if (planar_tolerance < (double)CONCAT44(uVar10,uVar9) - dVar11) goto LAB_0050a809;
          }
LAB_0050a789:
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
      }
      if (0.0 <= angle_tolerance_radians) {
        corner_normals_00 = local_88;
        GetCornerNormals(this,vertex_list,corner_normals_00);
        dVar11 = ON_3dVector::UnsetVector.x;
        if (3.141592653589793 <= angle_tolerance_radians) {
          uVar9 = 0;
          uVar10 = 0xbff00000;
        }
        else {
          dVar1 = cos(angle_tolerance_radians);
          uVar9 = SUB84(dVar1,0);
          uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        lVar8 = 1;
        do {
          if ((dVar11 != corner_normals_00->x) || (NAN(dVar11) || NAN(corner_normals_00->x))) {
            if (((dVar11 != corner_normals_00[2].x) || (NAN(dVar11) || NAN(corner_normals_00[2].x)))
               && (dVar1 = ON_3dVector::operator*(corner_normals_00,corner_normals_00 + 2),
                  dVar1 < (double)CONCAT44(uVar10,uVar9))) goto LAB_0050a809;
          }
          corner_normals_00 = corner_normals_00 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 == 0);
      }
    }
  }
  else {
    if (face_plane_equation != (ON_PlaneEquation *)0x0) {
      face_plane_equation->z = ON_PlaneEquation::UnsetPlaneEquation.z;
      face_plane_equation->d = dVar2;
      face_plane_equation->x = dVar11;
      face_plane_equation->y = dVar1;
    }
LAB_0050a809:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ON_MeshFace::IsPlanar( 
  double planar_tolerance,
  double angle_tolerance_radians,
  const class ON_3dPointListRef& vertex_list, 
  ON_PlaneEquation* face_plane_equation
  ) const
{
  ON_PlaneEquation e;

  for (;;)
  {
    if (!GetPlaneEquation(vertex_list, e))
      break;

    if ( face_plane_equation )
      *face_plane_equation = e;

    if (vi[2] == vi[3])
      return true; // triangle

    if (planar_tolerance >= 0.0)
    {
      double h0, h1, h;
      h0 = h1 = 0.0;
      for (int i = 1; i < 3; i++)
      {
        if (vi[i - 1] == vi[i])
          continue;
        h = e.ValueAt(vertex_list[vi[i]]);
        if (h < h0)
          h0 = h;
        else if (h > h1)
          h1 = h;
        else
          continue;
        if (h1 - h0 > planar_tolerance)
        {
          return false;
        }
      }
    }

    if (angle_tolerance_radians >= 0.0)
    {
      ON_3dVector corner_normals[4];
      GetCornerNormals(vertex_list, corner_normals);
      const double unset_x = ON_3dVector::UnsetVector.x;
      const double cos_atol = (angle_tolerance_radians < ON_PI) ? cos(angle_tolerance_radians) : -1.0;
      for (unsigned int i = 0; i < 2; i++)
      {
        if (unset_x != corner_normals[i].x && unset_x != corner_normals[i+2].x && corner_normals[i] * corner_normals[i+2] < cos_atol)
          return false;
      }
    }

    return true;
  }

  if (face_plane_equation)
    *face_plane_equation = ON_PlaneEquation::UnsetPlaneEquation;

  return false;
}